

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.h
# Opt level: O2

void __thiscall
chrono::ChQuaternion<double>::Q_from_Rotv(ChQuaternion<double> *this,ChVector<double> *angle_axis)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  undefined1 auVar4 [64];
  undefined1 extraout_var [56];
  
  auVar4._0_8_ = ChVector<double>::Length2(angle_axis);
  auVar4._8_56_ = extraout_var;
  if (auVar4._0_8_ <= 1e-30) {
    this->m_data[0] = 1.0;
    this->m_data[1] = angle_axis->m_data[0] * 0.5;
    this->m_data[2] = angle_axis->m_data[1] * 0.5;
    dVar2 = angle_axis->m_data[2] * 0.5;
  }
  else {
    if (auVar4._0_8_ < 0.0) {
      dVar3 = sqrt(auVar4._0_8_);
    }
    else {
      auVar1 = vsqrtsd_avx(auVar4._0_16_,auVar4._0_16_);
      dVar3 = auVar1._0_8_;
    }
    dVar2 = sin(dVar3 * 0.5);
    dVar2 = dVar2 / dVar3;
    dVar3 = cos(dVar3 * 0.5);
    this->m_data[0] = dVar3;
    this->m_data[1] = dVar2 * angle_axis->m_data[0];
    this->m_data[2] = dVar2 * angle_axis->m_data[1];
    dVar2 = dVar2 * angle_axis->m_data[2];
  }
  this->m_data[3] = dVar2;
  return;
}

Assistant:

inline void ChQuaternion<Real>::Q_from_Rotv(const ChVector<Real>& angle_axis) {
    Real theta_squared = angle_axis.Length2();
    // For non-zero rotation:
    if (theta_squared > 1e-30) {
        Real theta = sqrt(theta_squared);
        Real half_theta = theta / 2;
        Real k = sin(half_theta) / theta;
        m_data[0] = cos(half_theta);
        m_data[1] = angle_axis.x() * k;
        m_data[2] = angle_axis.y() * k;
        m_data[3] = angle_axis.z() * k;
    } else {
        // For almost zero rotation:
        Real k(0.5);
        m_data[0] = Real(1.0);
        m_data[1] = angle_axis.x() * k;
        m_data[2] = angle_axis.y() * k;
        m_data[3] = angle_axis.z() * k;
    }
}